

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O1

_Bool av1_ext_part_send_features
                (ExtPartController *ext_part_controller,aom_partition_features_t *features)

{
  aom_ext_part_status_t aVar1;
  
  aVar1 = (*(ext_part_controller->funcs).send_features)(ext_part_controller->model,features);
  return aVar1 == AOM_EXT_PART_OK;
}

Assistant:

bool av1_ext_part_send_features(ExtPartController *ext_part_controller,
                                const aom_partition_features_t *features) {
  assert(ext_part_controller != NULL);
  assert(ext_part_controller->ready);
  assert(features != NULL);
  const aom_ext_part_status_t status = ext_part_controller->funcs.send_features(
      ext_part_controller->model, features);
  if (status != AOM_EXT_PART_OK) return false;
  return true;
}